

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O0

ostream * libDAI::operator<<(ostream *os,FactorGraph *fg)

{
  bool bVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  TFactor<double> *pTVar5;
  size_type sVar6;
  long lVar7;
  pointer pVVar8;
  size_t sVar9;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *p_Var10;
  ostream *poVar11;
  long *in_RSI;
  ostream *in_RDI;
  double dVar12;
  char buf [20];
  size_t k_1;
  size_t k;
  size_t nr_nonzeros;
  const_iterator i_1;
  const_iterator i;
  size_t I;
  VarSet *in_stack_ffffffffffffff48;
  TFactor<double> *in_stack_ffffffffffffff50;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *in_stack_ffffffffffffff58;
  VarSet local_78;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *local_58;
  ulong local_50;
  Var *local_48;
  Var *local_40;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_38;
  Var *local_30;
  Var *local_28;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_20;
  ulong local_18;
  long *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar2 = (**(code **)(*in_RSI + 0x48))();
  pvVar3 = (void *)std::ostream::operator<<(in_RDI,uVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  for (local_18 = 0; uVar2 = local_18, uVar4 = (**(code **)(*local_10 + 0x48))(), uVar2 < uVar4;
      local_18 = local_18 + 1) {
    std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
    poVar11 = local_8;
    pTVar5 = (TFactor<double> *)(**(code **)(*local_10 + 0x50))(local_10,local_18);
    TFactor<double>::vars(pTVar5);
    sVar6 = VarSet::size((VarSet *)0xb3a12d);
    pvVar3 = (void *)std::ostream::operator<<(poVar11,sVar6);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    pTVar5 = (TFactor<double> *)(**(code **)(*local_10 + 0x50))(local_10,local_18);
    TFactor<double>::vars(pTVar5);
    local_20._M_current = (Var *)VarSet::begin(in_stack_ffffffffffffff48);
    while( true ) {
      pTVar5 = (TFactor<double> *)(**(code **)(*local_10 + 0x50))(local_10,local_18);
      TFactor<double>::vars(pTVar5);
      local_28 = (Var *)VarSet::end(in_stack_ffffffffffffff48);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                          *)in_stack_ffffffffffffff48);
      poVar11 = local_8;
      if (!bVar1) break;
      pVVar8 = __gnu_cxx::
               __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
               ::operator->(&local_20);
      lVar7 = Var::label(pVVar8);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar7);
      std::operator<<(poVar11," ");
      local_30 = (Var *)__gnu_cxx::
                        __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        ::operator++(in_stack_ffffffffffffff58,
                                     (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    }
    std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
    pTVar5 = (TFactor<double> *)(**(code **)(*local_10 + 0x50))(local_10,local_18);
    TFactor<double>::vars(pTVar5);
    local_38._M_current = (Var *)VarSet::begin(in_stack_ffffffffffffff48);
    while( true ) {
      pTVar5 = (TFactor<double> *)(**(code **)(*local_10 + 0x50))(local_10,local_18);
      TFactor<double>::vars(pTVar5);
      local_40 = (Var *)VarSet::end(in_stack_ffffffffffffff48);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                          *)in_stack_ffffffffffffff48);
      poVar11 = local_8;
      if (!bVar1) break;
      pVVar8 = __gnu_cxx::
               __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
               ::operator->(&local_38);
      sVar9 = Var::states(pVVar8);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,sVar9);
      std::operator<<(poVar11," ");
      local_48 = (Var *)__gnu_cxx::
                        __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        ::operator++(in_stack_ffffffffffffff58,
                                     (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    }
    std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
    local_50 = 0;
    local_58 = (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                *)0x0;
    while( true ) {
      in_stack_ffffffffffffff58 = local_58;
      (**(code **)(*local_10 + 0x50))(local_10,local_18);
      p_Var10 = (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 *)TFactor<double>::stateSpace((TFactor<double> *)0xb3a344);
      if (p_Var10 <= in_stack_ffffffffffffff58) break;
      (**(code **)(*local_10 + 0x50))(local_10,local_18);
      dVar12 = TFactor<double>::operator[]
                         (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        local_50 = local_50 + 1;
      }
      local_58 = (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                  *)((long)&local_58->_M_current + 1);
    }
    pvVar3 = (void *)std::ostream::operator<<(local_8,local_50);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_78._statespace = 0;
    while( true ) {
      in_stack_ffffffffffffff50 = (TFactor<double> *)local_78._statespace;
      (**(code **)(*local_10 + 0x50))(local_10,local_18);
      pTVar5 = (TFactor<double> *)TFactor<double>::stateSpace((TFactor<double> *)0xb3a3f7);
      if (pTVar5 <= in_stack_ffffffffffffff50) break;
      (**(code **)(*local_10 + 0x50))(local_10,local_18);
      dVar12 = TFactor<double>::operator[]
                         (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        in_stack_ffffffffffffff48 = &local_78;
        (**(code **)(*local_10 + 0x50))(local_10,local_18);
        TFactor<double>::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
        sprintf((char *)in_stack_ffffffffffffff48,"%18.14g");
        poVar11 = (ostream *)std::ostream::operator<<(local_8,local_78._statespace);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = std::operator<<(poVar11,(char *)&local_78);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      }
      local_78._statespace =
           (long)&(((VarSet *)local_78._statespace)->_vars).
                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
    }
  }
  return local_8;
}

Assistant:

std::ostream& operator << (std::ostream& os, const FactorGraph& fg) {
        os << fg.nrFactors() << endl;

        for( size_t I = 0; I < fg.nrFactors(); I++ ) {
            os << endl;
            os << fg.factor(I).vars().size() << endl;
            for( VarSet::const_iterator i = fg.factor(I).vars().begin(); i != fg.factor(I).vars().end(); i++ )
                os << i->label() << " ";
            os << endl;
            for( VarSet::const_iterator i = fg.factor(I).vars().begin(); i != fg.factor(I).vars().end(); i++ )
                os << i->states() << " ";
            os << endl;
            size_t nr_nonzeros = 0;
            for( size_t k = 0; k < fg.factor(I).stateSpace(); k++ )
                if( fg.factor(I)[k] != 0.0 )
                    nr_nonzeros++;
            os << nr_nonzeros << endl;
            for( size_t k = 0; k < fg.factor(I).stateSpace(); k++ )
                if( fg.factor(I)[k] != 0.0 ) {
                    char buf[20];
                    sprintf(buf,"%18.14g", fg.factor(I)[k]);
                    os << k << " " << buf << endl;
                }
        }

        return(os);
    }